

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_rollback_hook(sqlite3 *db,_func_void_void_ptr *xCallback,void *pArg)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *pRet;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c614);
  pvVar1 = *(void **)(in_RDI + 0x120);
  *(undefined8 *)(in_RDI + 0x128) = in_RSI;
  *(undefined8 *)(in_RDI + 0x120) = in_RDX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c655);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_rollback_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  void (*xCallback)(void*), /* Callback function */
  void *pArg                /* Argument to the function */
){
  void *pRet;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pRet = db->pRollbackArg;
  db->xRollbackCallback = xCallback;
  db->pRollbackArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pRet;
}